

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBlit.h
# Opt level: O0

void irr::executeBlit_ColorAlpha_16_to_16(SBlitJob *job)

{
  u16 alpha_00;
  u16 c1;
  u16 uVar1;
  u32 uVar2;
  long in_RDI;
  u32 dx;
  u32 dy;
  u32 src;
  u16 alpha;
  u16 *dst;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_10;
  
  local_10 = *(long *)(in_RDI + 0x30);
  uVar2 = extractAlpha(*(u32 *)(in_RDI + 0x20));
  alpha_00 = (u16)(uVar2 >> 3);
  if (alpha_00 != 0) {
    c1 = video::A8R8G8B8toA1R5G5B5(*(u32 *)(in_RDI + 0x20));
    for (local_1c = 0; local_1c != *(int *)(in_RDI + 0x3c); local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 != *(uint *)(in_RDI + 0x38); local_20 = local_20 + 1) {
        uVar1 = PixelBlend16(*(u16 *)(local_10 + (ulong)local_20 * 2),c1,alpha_00);
        *(u16 *)(local_10 + (ulong)local_20 * 2) = uVar1;
      }
      local_10 = local_10 + (ulong)*(uint *)(in_RDI + 0x4c);
    }
  }
  return;
}

Assistant:

static void executeBlit_ColorAlpha_16_to_16(const SBlitJob *job)
{
	u16 *dst = (u16 *)job->dst;

	const u16 alpha = extractAlpha(job->argb) >> 3;
	if (0 == alpha)
		return;
	const u32 src = video::A8R8G8B8toA1R5G5B5(job->argb);

	for (u32 dy = 0; dy != job->height; ++dy) {
		for (u32 dx = 0; dx != job->width; ++dx) {
			dst[dx] = PixelBlend16(dst[dx], src, alpha);
		}
		dst = (u16 *)((u8 *)(dst) + job->dstPitch);
	}
}